

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O3

void fsnav_linal_uuT(double *res,double *u,size_t n)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  double *pdVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  double dVar15;
  
  if (n != 0) {
    lVar13 = n * 2;
    lVar12 = 0;
    lVar7 = 0;
    sVar6 = 0;
    pdVar8 = u;
    do {
      lVar13 = lVar13 + -2;
      pdVar4 = u + lVar7;
      sVar5 = sVar6;
      pdVar9 = pdVar8;
      lVar10 = lVar7;
      lVar11 = lVar12;
      lVar14 = lVar13;
      do {
        dVar15 = u[lVar10] * u[((~sVar5 + n * 2) * sVar5 >> 1) + sVar5];
        res[lVar10] = dVar15;
        lVar7 = lVar10 + 1;
        uVar1 = sVar5 + 1;
        if (n <= uVar1) break;
        lVar3 = 1;
        do {
          dVar15 = dVar15 + pdVar4[lVar3] * *(double *)((long)pdVar9 + lVar3 * 8 + lVar11 * 4);
          res[lVar10] = dVar15;
          lVar2 = lVar3 + sVar5;
          lVar3 = lVar3 + 1;
        } while (lVar2 + 1U < n);
        pdVar4 = pdVar4 + 1;
        pdVar9 = pdVar9 + 1;
        lVar11 = lVar11 + lVar14;
        lVar14 = lVar14 + -2;
        sVar5 = uVar1;
        lVar10 = lVar7;
      } while (uVar1 < n);
      sVar6 = sVar6 + 1;
      pdVar8 = pdVar8 + 1;
      lVar12 = lVar12 + lVar13;
    } while (sVar6 != n);
  }
  return;
}

Assistant:

void fsnav_linal_uuT(double* res, double* u, const size_t n)
{
	size_t i, j, k, p, q, r;

	for (i = 0, k = 0; i < n; i++) {
		for (j = i; j < n; j++, k++) {
			fsnav_linal_u_ij2k(&p, j, j, n);
			res[k] = u[k]*u[p];
			for (q = k+1, p++, r = j+1; r < n; q++, p++, r++)
				res[k] += u[q]*u[p];
		}
	}
}